

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Conflict_Map::remove_edge_larger_colors(Conflict_Map *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  VarId *in_RDI;
  int pri1;
  VarId var1;
  iterator __end3;
  iterator __begin3;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range3;
  pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  *edgepair;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *__range2;
  VarId var;
  int priority;
  VarId *in_stack_ffffffffffffff70;
  VarId *in_stack_ffffffffffffff78;
  Conflict_Map *in_stack_ffffffffffffff80;
  _Self local_58;
  _Self local_50;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *local_48;
  reference local_40;
  _Self local_38;
  _Self local_30;
  VarId *local_28;
  int local_c;
  
  sVar3 = std::
          map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::size((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)0x1aa117);
  if (sVar3 != 0) {
    local_c = 9999999;
    mir::inst::VarId::VarId(in_stack_ffffffffffffff70);
    local_28 = in_RDI + 0xc;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         ::begin((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)in_RDI);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         ::end((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)in_RDI);
    while (bVar1 = std::operator!=(&local_30,&local_38), bVar1) {
      local_40 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                              *)0x1aa186);
      local_48 = &local_40->second;
      local_50._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_RDI);
      local_58._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_RDI);
      while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1aa1d6);
        mir::inst::VarId::VarId(in_stack_ffffffffffffff70,in_RDI);
        mir::inst::VarId::VarId(in_stack_ffffffffffffff70,in_RDI);
        iVar2 = get_priority(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        if (iVar2 < local_c) {
          local_c = iVar2;
          mir::inst::VarId::operator=(in_stack_ffffffffffffff70,in_RDI);
        }
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_ffffffffffffff70);
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                    *)in_stack_ffffffffffffff70);
    }
    mir::inst::VarId::VarId(in_stack_ffffffffffffff70,in_RDI);
    remove_node((Conflict_Map *)__end3._M_node,(VarId *)var1._8_8_,
                var1.super_Displayable._vptr_Displayable._7_1_);
  }
  return;
}

Assistant:

void remove_edge_larger_colors() {
    if (!edge_vars.size()) {
      return;
    }
    int priority = 9999999;
    // mir::inst::VarId var;
    // for (auto& pair : dynamic_Map) {
    //   if (get_priority(pair.first) < priority) {
    //     var = pair.first;
    //   }
    // }
    mir::inst::VarId var;
    for (auto& edgepair : edge_vars) {
      for (auto var1 : edgepair.second) {
        auto pri1 = get_priority(var1);
        if (pri1 < priority) {
          priority = pri1;
          var = var1;
        }
      }
    }
    remove_node(var, false);
  }